

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O3

void __thiscall xercesc_4_0::CMStateSet::CMStateSet(CMStateSet *this,CMStateSet *toCopy)

{
  ulong uVar1;
  MemoryManager *pMVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLSize_t XVar6;
  CMDynamicBuffer *pCVar5;
  
  uVar1 = toCopy->fBitCount;
  this->fBitCount = uVar1;
  this->fDynamicBuffer = (CMDynamicBuffer *)0x0;
  if (uVar1 < 0x81) {
    uVar3 = *(undefined8 *)(toCopy->fBits + 2);
    *(undefined8 *)this->fBits = *(undefined8 *)toCopy->fBits;
    *(undefined8 *)(this->fBits + 2) = uVar3;
  }
  else {
    pMVar2 = toCopy->fDynamicBuffer->fMemoryManager;
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,0x18);
    pCVar5 = (CMDynamicBuffer *)CONCAT44(extraout_var,iVar4);
    this->fDynamicBuffer = pCVar5;
    pMVar2 = toCopy->fDynamicBuffer->fMemoryManager;
    pCVar5->fMemoryManager = pMVar2;
    XVar6 = ((this->fBitCount >> 10) + 1) - (ulong)((this->fBitCount & 0x3ff) == 0);
    pCVar5->fArraySize = XVar6;
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,XVar6 * 8);
    pCVar5 = this->fDynamicBuffer;
    pCVar5->fBitArray = (XMLInt32 **)CONCAT44(extraout_var_00,iVar4);
    if (pCVar5->fArraySize != 0) {
      XVar6 = 0;
      do {
        if (toCopy->fDynamicBuffer->fBitArray[XVar6] == (XMLInt32 *)0x0) {
          pCVar5->fBitArray[XVar6] = (XMLInt32 *)0x0;
        }
        else {
          allocateChunk(this,XVar6);
          memcpy(this->fDynamicBuffer->fBitArray[XVar6],toCopy->fDynamicBuffer->fBitArray[XVar6],
                 0x80);
        }
        XVar6 = XVar6 + 1;
        pCVar5 = this->fDynamicBuffer;
      } while (XVar6 < pCVar5->fArraySize);
    }
  }
  return;
}

Assistant:

CMStateSet(const CMStateSet& toCopy) :
        XMemory(toCopy)
      , fBitCount(toCopy.fBitCount)
      , fDynamicBuffer(0)
    {
        //
        //  See if we need to allocate the byte array or whether we can live
        //  within the cahced bit high performance scheme.
        //
        if (fBitCount > (CMSTATE_CACHED_INT32_SIZE * 32))
        {
            fDynamicBuffer = (CMDynamicBuffer*) toCopy.fDynamicBuffer->fMemoryManager->allocate(sizeof(CMDynamicBuffer));
            fDynamicBuffer->fMemoryManager = toCopy.fDynamicBuffer->fMemoryManager;
            fDynamicBuffer->fArraySize = fBitCount / CMSTATE_BITFIELD_CHUNK;
            if (fBitCount % CMSTATE_BITFIELD_CHUNK)
                fDynamicBuffer->fArraySize++;
            fDynamicBuffer->fBitArray = (XMLInt32**) fDynamicBuffer->fMemoryManager->allocate(fDynamicBuffer->fArraySize*sizeof(XMLInt32*));
            for(XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                if(toCopy.fDynamicBuffer->fBitArray[index]!=NULL)
                {
                    allocateChunk(index);
                    memcpy((void *) fDynamicBuffer->fBitArray[index],
                           (const void *) toCopy.fDynamicBuffer->fBitArray[index],
                           CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                }
                else
                    fDynamicBuffer->fBitArray[index]=NULL;
            }
        }
        else
        {
            memcpy((void *) fBits,
                   (const void *) toCopy.fBits,
                   CMSTATE_CACHED_INT32_SIZE * sizeof(XMLInt32));
        }
    }